

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1614385::HandleFilterCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  int iVar2;
  ulong uVar3;
  cmList *this_00;
  long lVar4;
  bool bVar5;
  FilterMode mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *var;
  string_view value;
  string_view pattern;
  optional<cmList> list;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar3 = lVar4 >> 5;
  if (uVar3 < 2) {
    local_78._0_8_ = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"sub-command FILTER requires a list to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (lVar4 == 0x40) {
    local_78._0_8_ = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"sub-command FILTER requires an operator to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (3 < uVar3) {
      pbVar6 = pbVar1 + 2;
      iVar2 = std::__cxx11::string::compare((char *)pbVar6);
      if (iVar2 == 0) {
        mode = INCLUDE;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)pbVar6);
        if (iVar2 != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,"sub-command FILTER does not recognize operator ",pbVar6);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((pointer)local_78._0_8_ == (pointer)local_68) {
            return false;
          }
          goto LAB_00408f97;
        }
        mode = EXCLUDE;
      }
      var = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
      GetList((optional<cmList> *)local_78,var,status->Makefile);
      bVar5 = true;
      if (local_68[8] != '\x01') goto LAB_00409158;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3;
      iVar2 = std::__cxx11::string::compare((char *)pbVar6);
      if (iVar2 == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
          this = status->Makefile;
          pattern._M_str = pbVar1[4]._M_dataplus._M_p;
          pattern._M_len = pbVar1[4]._M_string_length;
          this_00 = cmList::filter((cmList *)local_78,pattern,mode);
          cmList::to_string_abi_cxx11_((string *)(local_68 + 0x18),this_00);
          value._M_str = local_50._M_dataplus._M_p;
          value._M_len = local_50._M_string_length;
          cmMakefile::AddDefinition(this,var,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00409158;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_68 + 0x18),
                   "sub-command FILTER, mode REGEX requires five arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00409149;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_68 + 0x18),"sub-command FILTER does not recognize mode ",pbVar6);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00409149:
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      bVar5 = false;
LAB_00409158:
      if (local_68[8] == '\x01') {
        local_68[8] = '\0';
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
        return bVar5;
      }
      return bVar5;
    }
    local_78._0_8_ = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"sub-command FILTER requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((pointer)local_78._0_8_ == (pointer)local_68) {
    return false;
  }
LAB_00408f97:
  operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
  return false;
}

Assistant:

bool HandleFilterCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command FILTER requires a list to be specified.");
    return false;
  }

  if (args.size() < 3) {
    status.SetError(
      "sub-command FILTER requires an operator to be specified.");
    return false;
  }

  if (args.size() < 4) {
    status.SetError("sub-command FILTER requires a mode to be specified.");
    return false;
  }

  const std::string& op = args[2];
  cmList::FilterMode filterMode;
  if (op == "INCLUDE") {
    filterMode = cmList::FilterMode::INCLUDE;
  } else if (op == "EXCLUDE") {
    filterMode = cmList::FilterMode::EXCLUDE;
  } else {
    status.SetError("sub-command FILTER does not recognize operator " + op);
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list) {
    return true;
  }

  const std::string& mode = args[3];
  if (mode != "REGEX") {
    status.SetError("sub-command FILTER does not recognize mode " + mode);
    return false;
  }
  if (args.size() != 5) {
    status.SetError("sub-command FILTER, mode REGEX "
                    "requires five arguments.");
    return false;
  }
  const std::string& pattern = args[4];

  try {
    status.GetMakefile().AddDefinition(
      listName, list->filter(pattern, filterMode).to_string());
    return true;
  } catch (std::invalid_argument& e) {
    status.SetError(e.what());
    return false;
  }
}